

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall el::Logger::initUnflushedCount(Logger *this)

{
  char cVar1;
  EnumType lIndex;
  uint local_34;
  Logger *local_30;
  uint *local_28;
  code *local_20;
  code *local_18;
  
  base::utils::std::
  _Hashtable<el::Level,_std::pair<const_el::Level,_unsigned_int>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->m_unflushedCount)._M_h);
  local_28 = &local_34;
  local_34 = 2;
  local_18 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NwnUtilLib/easylogging++.cc:627:38)>
             ::_M_invoke;
  local_20 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NwnUtilLib/easylogging++.cc:627:38)>
             ::_M_manager;
  local_30 = this;
  do {
    cVar1 = (*local_18)(&local_30);
    if ((cVar1 != '\0') || (local_34 = local_34 * 2, 0x80 < local_34)) goto LAB_00160952;
  } while (local_20 != (code *)0x0);
  std::__throw_bad_function_call();
LAB_00160952:
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,3);
  }
  return;
}

Assistant:

void Logger::initUnflushedCount(void) {
  m_unflushedCount.clear();
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    m_unflushedCount.insert(std::make_pair(LevelHelper::castFromInt(lIndex), 0));
    return false;
  });
}